

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

int __thiscall btConvexHullInternal::Rational128::compare(Rational128 *this,Rational128 *b)

{
  int iVar1;
  uint uVar2;
  Int128 dbnLow;
  Int128 nbdLow;
  Int128 dbnHigh;
  Int128 nbdHigh;
  Int128 local_58;
  Int128 local_48;
  Int128 local_38;
  Int128 local_28;
  
  iVar1 = this->sign;
  if (iVar1 != b->sign) {
    return iVar1 - b->sign;
  }
  if (iVar1 == 0) {
    return 0;
  }
  if (this->isInt64 == true) {
    iVar1 = compare(b,(long)iVar1 * (this->numerator).low);
    return -iVar1;
  }
  DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
            (this->numerator,b->denominator,&local_48,&local_28);
  DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
            (this->denominator,b->numerator,&local_58,&local_38);
  if (local_38.high <= local_28.high) {
    uVar2 = 1;
    if (local_38.high < local_28.high) goto LAB_0012870d;
    if (local_38.low <= local_28.low) {
      if (local_38.low < local_28.low) goto LAB_0012870d;
      if (local_58.high <= local_48.high) {
        if ((local_48.high <= local_58.high) && (uVar2 = 0xffffffff, local_58.low <= local_48.low))
        {
          uVar2 = (uint)(local_58.low < local_48.low);
        }
        goto LAB_0012870d;
      }
    }
  }
  uVar2 = 0xffffffff;
LAB_0012870d:
  return uVar2 * this->sign;
}

Assistant:

int btConvexHullInternal::Rational128::compare(const Rational128& b) const
{
	if (sign != b.sign)
	{
		return sign - b.sign;
	}
	else if (sign == 0)
	{
		return 0;
	}
	if (isInt64)
	{
		return -b.compare(sign * (int64_t) numerator.low);
	}

	Int128 nbdLow, nbdHigh, dbnLow, dbnHigh;
	DMul<Int128, uint64_t>::mul(numerator, b.denominator, nbdLow, nbdHigh);
	DMul<Int128, uint64_t>::mul(denominator, b.numerator, dbnLow, dbnHigh);

	int cmp = nbdHigh.ucmp(dbnHigh);
	if (cmp)
	{
		return cmp * sign;
	}
	return nbdLow.ucmp(dbnLow) * sign;
}